

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::SetPropertyWPCache<int>
               (Var receiver,RecyclableObject *object,int propertyKey,Var newValue,
               ScriptContext *requestContext,PropertyOperationFlags propertyOperationFlags,
               PropertyValueInfo *info)

{
  code *pcVar1;
  undefined8 objectWithProperty;
  bool bVar2;
  InlineCacheFlags IVar3;
  BOOL BVar4;
  PropertyId PVar5;
  int iVar6;
  undefined4 *puVar7;
  UnscopablesWrapperObject *this;
  PropertyRecordUsageCache *pPVar8;
  RecyclableObject *pRVar9;
  Type *pTVar10;
  PropertyRecord *pPVar11;
  JavascriptProxy *this_00;
  ThreadContext *this_01;
  PolymorphicInlineCache *polymorphicInlineCache;
  Type *typeWithoutProperty;
  PropertyDescriptor existingDesc;
  RecyclableObject *receiverObject;
  anon_class_48_6_0022759e fn;
  JavascriptProxy *proxy;
  RecyclableObject *func;
  Var pvStack_48;
  DescriptorFlags flags;
  Var setterValueOrProxy;
  ScriptContext *pSStack_38;
  PropertyOperationFlags propertyOperationFlags_local;
  ScriptContext *requestContext_local;
  Var newValue_local;
  RecyclableObject *pRStack_20;
  int propertyKey_local;
  RecyclableObject *object_local;
  Var receiver_local;
  
  if (receiver != (Var)0x0) {
    setterValueOrProxy._4_4_ = propertyOperationFlags;
    pSStack_38 = requestContext;
    requestContext_local = (ScriptContext *)newValue;
    newValue_local._4_4_ = propertyKey;
    pRStack_20 = object;
    object_local = (RecyclableObject *)receiver;
    if (object == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x9b0,"(object)","object");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    bVar2 = TaggedNumber::Is(object_local);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x9b1,"(!TaggedNumber::Is(receiver))",
                                  "!TaggedNumber::Is(receiver)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    pvStack_48 = (Var)0x0;
    func._4_4_ = 0;
    BVar4 = CheckPrototypesForAccessorOrNonWritableProperty
                      (pRStack_20,newValue_local._4_4_,&stack0xffffffffffffffb8,
                       (DescriptorFlags *)((long)&func + 4),info,pSStack_38);
    if (BVar4 != 0) {
      if ((func._4_4_ & 1) != 1) {
        if ((func._4_4_ & 0x10) != 0x10) {
          if (((func._4_4_ & 2) != 2) || ((func._4_4_ & 4) != 0)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                        ,0x9dc,
                                        "((flags & Data) == Data && (flags & Writable) == None)",
                                        "(flags & Data) == Data && (flags & Writable) == None");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          this_01 = ScriptContext::GetThreadContext(pSStack_38);
          ThreadContext::AddImplicitCallFlags(this_01,ImplicitCall_NoOpSet);
          JavascriptError::ThrowCantAssignIfStrictMode(setterValueOrProxy._4_4_,pSStack_38);
          return 0;
        }
        bVar2 = VarIs<Js::JavascriptProxy>(pvStack_48);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x9ce,"(VarIs<JavascriptProxy>(setterValueOrProxy))",
                                      "VarIs<JavascriptProxy>(setterValueOrProxy)");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        this_00 = VarTo<Js::JavascriptProxy>(pvStack_48);
        pPVar8 = PropertyValueInfo::GetPropertyRecordUsageCache(info);
        if (pPVar8 != (PropertyRecordUsageCache *)0x0) {
          PropertyValueInfo::SetNoCache(info,(RecyclableObject *)this_00);
          PropertyValueInfo::DisablePrototypeCache(info,(RecyclableObject *)this_00);
        }
        BVar4 = Js::JavascriptProxy::SetPropertyTrap
                          (this_00,object_local,SetPropertyWPCacheKind,newValue_local._4_4_,
                           requestContext_local,pSStack_38,setterValueOrProxy._4_4_,0);
        return BVar4;
      }
      bVar2 = JavascriptError::ThrowIfStrictModeUndefinedSetter
                        (setterValueOrProxy._4_4_,pvStack_48,pSStack_38);
      if (!bVar2) {
        if (pvStack_48 != (Var)0x0) {
          bVar2 = VarIs<Js::UnscopablesWrapperObject>(object_local);
          if (bVar2) {
            this = UnsafeVarTo<Js::UnscopablesWrapperObject>(object_local);
            object_local = UnscopablesWrapperObject::GetWrappedObject(this);
          }
          else {
            pPVar8 = PropertyValueInfo::GetPropertyRecordUsageCache(info);
            if ((pPVar8 != (PropertyRecordUsageCache *)0x0) &&
               (bVar2 = IsUndefinedAccessor(pvStack_48,pSStack_38), !bVar2)) {
              pRVar9 = VarTo<Js::RecyclableObject>(object_local);
              pTVar10 = RecyclableObject::GetType(pRStack_20);
              pPVar8 = PropertyValueInfo::GetPropertyRecordUsageCache(info);
              pPVar11 = PropertyRecordUsageCache::GetPropertyRecord(pPVar8);
              PVar5 = PropertyRecord::GetPropertyId(pPVar11);
              CacheOperators::CachePropertyWrite(pRVar9,false,pTVar10,PVar5,info,pSStack_38);
            }
          }
          pRVar9 = VarTo<Js::RecyclableObject>(pvStack_48);
          CallSetter(pRVar9,object_local,requestContext_local,pSStack_38);
        }
        return 1;
      }
      return 1;
    }
    BVar4 = IsObject(object_local);
    if (BVar4 == 0) {
      JavascriptError::ThrowCantAssignIfStrictMode(setterValueOrProxy._4_4_,pSStack_38);
      return 0;
    }
    existingDesc._40_8_ = VarTo<Js::RecyclableObject>(object_local);
    if (object_local != pRStack_20) {
      PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)&typeWithoutProperty);
      BVar4 = GetOwnPropertyDescriptor
                        ((RecyclableObject *)existingDesc._40_8_,newValue_local._4_4_,pSStack_38,
                         (PropertyDescriptor *)&typeWithoutProperty);
      if ((BVar4 != 0) &&
         (bVar2 = PropertyDescriptor::IsAccessorDescriptor
                            ((PropertyDescriptor *)&typeWithoutProperty), bVar2)) {
        return 0;
      }
    }
    pTVar10 = RecyclableObject::GetType(pRStack_20);
    iVar6 = (**(code **)(*(long *)existingDesc._40_8_ + 0xb8))
                      (existingDesc._40_8_,newValue_local._4_4_,requestContext_local,
                       setterValueOrProxy._4_4_,info);
    if (iVar6 != 0) {
      bVar2 = VarIs<Js::JavascriptProxy>(object_local);
      if ((((!bVar2) &&
           (pPVar8 = PropertyValueInfo::GetPropertyRecordUsageCache(info),
           pPVar8 != (PropertyRecordUsageCache *)0x0)) &&
          (IVar3 = PropertyValueInfo::GetFlags(info), IVar3 != InlineCacheSetterFlag)) &&
         (BVar4 = RecyclableObject::IsExternal(pRStack_20), BVar4 == 0)) {
        pRVar9 = VarTo<Js::RecyclableObject>(object_local);
        pPVar8 = PropertyValueInfo::GetPropertyRecordUsageCache(info);
        pPVar11 = PropertyRecordUsageCache::GetPropertyRecord(pPVar8);
        PVar5 = PropertyRecord::GetPropertyId(pPVar11);
        CacheOperators::CachePropertyWrite(pRVar9,false,pTVar10,PVar5,info,pSStack_38);
        pRVar9 = PropertyValueInfo::GetInstance(info);
        if (pRVar9 == (RecyclableObject *)existingDesc._40_8_) {
          pPVar8 = PropertyValueInfo::GetPropertyRecordUsageCache(info);
          polymorphicInlineCache = PropertyRecordUsageCache::GetLdElemInlineCache(pPVar8);
          bVar2 = PropertyValueInfo::AllowResizingPolymorphicInlineCache(info);
          PropertyValueInfo::SetCacheInfo(info,polymorphicInlineCache,bVar2);
          pRVar9 = pRStack_20;
          objectWithProperty = existingDesc._40_8_;
          pPVar8 = PropertyValueInfo::GetPropertyRecordUsageCache(info);
          pPVar11 = PropertyRecordUsageCache::GetPropertyRecord(pPVar8);
          PVar5 = PropertyRecord::GetPropertyId(pPVar11);
          CacheOperators::CachePropertyRead
                    (pRVar9,(RecyclableObject *)objectWithProperty,false,PVar5,false,info,pSStack_38
                    );
        }
      }
      return 1;
    }
  }
  return 0;
}

Assistant:

BOOL JavascriptOperators::SetPropertyWPCache(Var receiver, RecyclableObject* object, PropertyKeyType propertyKey, Var newValue, ScriptContext* requestContext, PropertyOperationFlags propertyOperationFlags, _Inout_ PropertyValueInfo * info)
    {
        if (receiver)
        {
            AnalysisAssert(object);
            Assert(!TaggedNumber::Is(receiver));
            Var setterValueOrProxy = nullptr;
            DescriptorFlags flags = None;
            if (JavascriptOperators::CheckPrototypesForAccessorOrNonWritableProperty(object, propertyKey, &setterValueOrProxy, &flags, info, requestContext))
            {
                if ((flags & Accessor) == Accessor)
                {
                    if (JavascriptError::ThrowIfStrictModeUndefinedSetter(propertyOperationFlags, setterValueOrProxy, requestContext))
                    {
                        return TRUE;
                    }
                    if (setterValueOrProxy)
                    {
                        if (VarIs<UnscopablesWrapperObject>(receiver))
                        {
                            receiver = (UnsafeVarTo<UnscopablesWrapperObject>(receiver))->GetWrappedObject();
                        }
                        else if (info->GetPropertyRecordUsageCache() && !JavascriptOperators::IsUndefinedAccessor(setterValueOrProxy, requestContext))
                        {
                            CacheOperators::CachePropertyWrite(VarTo<RecyclableObject>(receiver), false, object->GetType(), info->GetPropertyRecordUsageCache()->GetPropertyRecord()->GetPropertyId(), info, requestContext);
                        }
                        RecyclableObject* func = VarTo<RecyclableObject>(setterValueOrProxy);

                        JavascriptOperators::CallSetter(func, receiver, newValue, requestContext);
                    }
                    return TRUE;
                }
                else if ((flags & Proxy) == Proxy)
                {
                    Assert(VarIs<JavascriptProxy>(setterValueOrProxy));
                    JavascriptProxy* proxy = VarTo<JavascriptProxy>(setterValueOrProxy);
                    auto fn = [&](RecyclableObject* target) -> BOOL {
                        return JavascriptOperators::SetPropertyWPCache(receiver, target, propertyKey, newValue, requestContext, propertyOperationFlags, info);
                    };
                    if (info->GetPropertyRecordUsageCache())
                    {
                        PropertyValueInfo::SetNoCache(info, proxy);
                        PropertyValueInfo::DisablePrototypeCache(info, proxy);
                    }
                    return proxy->SetPropertyTrap(receiver, JavascriptProxy::SetPropertyTrapKind::SetPropertyWPCacheKind, propertyKey, newValue, requestContext, propertyOperationFlags);
                }
                else
                {
                    Assert((flags & Data) == Data && (flags & Writable) == None);

                    requestContext->GetThreadContext()->AddImplicitCallFlags(ImplicitCall_NoOpSet);
                    JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags, requestContext);
                    return FALSE;
                }
            }
            else if (!JavascriptOperators::IsObject(receiver))
            {
                JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags, requestContext);
                return FALSE;
            }

            RecyclableObject* receiverObject = VarTo<RecyclableObject>(receiver);
            if (receiver != object)
            {
                // If the receiver object has the property and it is an accessor then return false
                PropertyDescriptor existingDesc;
                if (JavascriptOperators::GetOwnPropertyDescriptor(receiverObject, propertyKey, requestContext, &existingDesc)
                    && existingDesc.IsAccessorDescriptor())
                {
                    return FALSE;
                }
            }

            Type *typeWithoutProperty = object->GetType();
            // in 9.1.9, step 5, we should return false if receiver is not object, and that will happen in default RecyclableObject operation anyhow.
            if (receiverObject->SetProperty(propertyKey, newValue, propertyOperationFlags, info))
            {
                if (!VarIs<JavascriptProxy>(receiver) && info->GetPropertyRecordUsageCache() && info->GetFlags() != InlineCacheSetterFlag && !object->IsExternal())
                {
                    CacheOperators::CachePropertyWrite(VarTo<RecyclableObject>(receiver), false, typeWithoutProperty, info->GetPropertyRecordUsageCache()->GetPropertyRecord()->GetPropertyId(), info, requestContext);

                    if (info->GetInstance() == receiverObject)
                    {
                        PropertyValueInfo::SetCacheInfo(info, info->GetPropertyRecordUsageCache()->GetLdElemInlineCache(), info->AllowResizingPolymorphicInlineCache());
                        CacheOperators::CachePropertyRead(object, receiverObject, false, info->GetPropertyRecordUsageCache()->GetPropertyRecord()->GetPropertyId(), false, info, requestContext);
                    }
                }
                return TRUE;
            }
        }

        return FALSE;
    }